

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::MarkOrCopy(FlowBuffer *this)

{
  FlowBuffer *in_RDI;
  
  if ((in_RDI->message_complete_ & 1U) == 0) {
    if (in_RDI->mode_ == CR_OR_LF_1) {
      MarkOrCopyLine(in_RDI);
    }
    else if (in_RDI->mode_ == FRAME_MODE) {
      MarkOrCopyFrame(in_RDI);
    }
  }
  return;
}

Assistant:

void FlowBuffer::MarkOrCopy()
	{
	if ( ! message_complete_ )
		{
		switch ( mode_ )
			{
			case LINE_MODE:
				MarkOrCopyLine();
				break;

			case FRAME_MODE:
				MarkOrCopyFrame();
				break;

			default:
				break;
			}
		}
	}